

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

HighsInt __thiscall HighsLpRelaxation::LpRow::getRowLen(LpRow *this,HighsMipSolver *mipsolver)

{
  pointer pHVar1;
  reference pvVar2;
  int *in_RDI;
  HighsInt in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  value_type vVar3;
  HighsInt local_4;
  
  if (*in_RDI == 0) {
    pHVar1 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x602dff);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&pHVar1->ARstart_,(long)(in_RDI[1] + 1));
    vVar3 = *pvVar2;
    pHVar1 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x602e33);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&pHVar1->ARstart_,(long)in_RDI[1]);
    local_4 = vVar3 - *pvVar2;
  }
  else if (*in_RDI == 1) {
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x602dd4)
    ;
    local_4 = HighsCutPool::getRowLength
                        ((HighsCutPool *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

HighsInt HighsLpRelaxation::LpRow::getRowLen(
    const HighsMipSolver& mipsolver) const {
  switch (origin) {
    case kCutPool:
      return mipsolver.mipdata_->cutpool.getRowLength(index);
    case kModel:
      return mipsolver.mipdata_->ARstart_[index + 1] -
             mipsolver.mipdata_->ARstart_[index];
  };

  assert(false);
  return -1;
}